

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.hpp
# Opt level: O2

var cs_impl::fiber::await<cs_impl::runtime_cs_ext::async_callable>(async_callable *func)

{
  future_status fVar1;
  routine_t rVar2;
  duration<long,_std::ratio<1L,_1000L>_> local_38;
  future<cs_impl::any> future;
  
  LOCK();
  cs::global_thread_counter = cs::global_thread_counter + 1;
  UNLOCK();
  std::async<cs_impl::runtime_cs_ext::async_callable&>((launch)&future,(async_callable *)0x1);
  local_38.__r = 0;
  fVar1 = std::__basic_future<cs_impl::any>::wait_for<long,std::ratio<1l,1000l>>
                    (&future.super___basic_future<cs_impl::any>,&local_38);
  while (fVar1 == timeout) {
    rVar2 = current();
    if (rVar2 != 0) {
      yield();
    }
    local_38.__r = 0;
    fVar1 = std::__basic_future<cs_impl::any>::wait_for<long,std::ratio<1l,1000l>>
                      (&future.super___basic_future<cs_impl::any>,&local_38);
  }
  std::future<cs_impl::any>::get((future<cs_impl::any> *)func);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&future.super___basic_future<cs_impl::any>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  LOCK();
  cs::global_thread_counter = cs::global_thread_counter + -1;
  UNLOCK();
  return (var)(proxy *)func;
}

Assistant:

inline cs::var await(Function &&func)
		{
			cs::thread_guard guard;
			auto future = std::async(std::launch::async, func);
			std::future_status status = future.wait_for(std::chrono::milliseconds(0));

			while (status == std::future_status::timeout) {
				if (current() != 0)
					yield();

				status = future.wait_for(std::chrono::milliseconds(0));
			}
			return future.get();
		}